

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>
::val(FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>
      *this)

{
  double dVar1;
  double dVar2;
  FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *pFVar3;
  FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *pFVar4;
  double dVar5;
  double dVar6;
  
  pFVar3 = (this->left_->fadexpr_).right_;
  dVar1 = ((this->left_->fadexpr_).left_)->val_;
  dVar5 = cos(((pFVar3->fadexpr_).expr_.fadexpr_.left_)->val_ *
              ((pFVar3->fadexpr_).expr_.fadexpr_.right_)->val_);
  pFVar4 = (this->right_->fadexpr_).right_;
  dVar2 = ((this->right_->fadexpr_).left_)->val_;
  dVar6 = sin(((pFVar4->fadexpr_).expr_.fadexpr_.left_)->val_ *
              ((pFVar4->fadexpr_).expr_.fadexpr_.right_)->val_);
  return dVar6 * dVar2 + dVar5 * dVar1;
}

Assistant:

const value_type val() const {return left_.val() + right_.val();}